

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void build_tls12_aad(uint8_t *aad,uint8_t type,uint64_t seq,uint16_t length)

{
  long lVar1;
  uint8_t *puVar2;
  
  puVar2 = aad;
  for (lVar1 = 0x38; lVar1 != -8; lVar1 = lVar1 + -8) {
    *puVar2 = (uint8_t)(seq >> ((byte)lVar1 & 0x3f));
    puVar2 = puVar2 + 1;
  }
  aad[8] = type;
  aad[9] = '\x03';
  aad[10] = '\x03';
  aad[0xb] = (uint8_t)(length >> 8);
  aad[0xc] = (uint8_t)length;
  return;
}

Assistant:

static void build_tls12_aad(uint8_t *aad, uint8_t type, uint64_t seq, uint16_t length)
{
    for (size_t i = 0; i < 8; ++i)
        aad[i] = (uint8_t)(seq >> (56 - i * 8));
    aad[8] = type;
    aad[9] = PTLS_RECORD_VERSION_MAJOR;
    aad[10] = PTLS_RECORD_VERSION_MINOR;
    aad[11] = length >> 8;
    aad[12] = (uint8_t)length;
}